

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilities.cpp
# Opt level: O0

void Rml::StringUtilities::ExpandString
               (StringList *string_list,String *string,char delimiter,char quote_character,
               char unquote_character,bool ignore_repeated_delimiters)

{
  bool bVar1;
  char *local_48;
  char *local_40;
  char *local_38;
  char *end_ptr;
  char *start_ptr;
  char *ptr;
  int quote_mode_depth;
  bool ignore_repeated_delimiters_local;
  char unquote_character_local;
  char quote_character_local;
  char delimiter_local;
  String *string_local;
  StringList *string_list_local;
  
  ptr._0_4_ = 0;
  ptr._4_1_ = ignore_repeated_delimiters;
  ptr._5_1_ = unquote_character;
  ptr._6_1_ = quote_character;
  ptr._7_1_ = delimiter;
  _quote_mode_depth = string;
  string_local = (String *)string_list;
  local_38 = (char *)::std::__cxx11::string::c_str();
  end_ptr = (char *)0x0;
  for (start_ptr = local_38; *start_ptr != '\0'; start_ptr = start_ptr + 1) {
    if (*start_ptr == ptr._6_1_) {
      ptr._0_4_ = (int)ptr + 1;
    }
    else if (*start_ptr == ptr._5_1_) {
      ptr._0_4_ = (int)ptr + -1;
    }
    if ((*start_ptr == ptr._7_1_) && ((int)ptr == 0)) {
      if (end_ptr == (char *)0x0) {
        if ((ptr._4_1_ & 1) == 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)string_local);
        }
      }
      else {
        local_40 = local_38 + 1;
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*&,char_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)string_local
                   ,&end_ptr,&local_40);
      }
      end_ptr = (char *)0x0;
    }
    else {
      bVar1 = IsWhitespace(*start_ptr);
      if ((!bVar1) || (0 < (int)ptr)) {
        if (end_ptr == (char *)0x0) {
          end_ptr = start_ptr;
        }
        local_38 = start_ptr;
      }
    }
  }
  if (end_ptr != (char *)0x0) {
    local_48 = local_38 + 1;
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*&,char_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)string_local,
               &end_ptr,&local_48);
  }
  return;
}

Assistant:

void StringUtilities::ExpandString(StringList& string_list, const String& string, const char delimiter, char quote_character, char unquote_character,
	bool ignore_repeated_delimiters)
{
	int quote_mode_depth = 0;
	const char* ptr = string.c_str();
	const char* start_ptr = nullptr;
	const char* end_ptr = ptr;

	while (*ptr)
	{
		// Increment the quote depth for each quote character encountered
		if (*ptr == quote_character)
		{
			++quote_mode_depth;
		}
		// And decrement it for every unquote character
		else if (*ptr == unquote_character)
		{
			--quote_mode_depth;
		}

		// If we encounter a delimiter while not in quote mode, add the item to the list
		if (*ptr == delimiter && quote_mode_depth == 0)
		{
			if (start_ptr)
				string_list.emplace_back(start_ptr, end_ptr + 1);
			else if (!ignore_repeated_delimiters)
				string_list.emplace_back();
			start_ptr = nullptr;
		}
		// Otherwise if its not white space or we're in quote mode, advance the pointers
		else if (!IsWhitespace(*ptr) || quote_mode_depth > 0)
		{
			if (!start_ptr)
				start_ptr = ptr;
			end_ptr = ptr;
		}

		ptr++;
	}

	// If there's data pending, add it.
	if (start_ptr)
		string_list.emplace_back(start_ptr, end_ptr + 1);
}